

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_database.cpp
# Opt level: O2

bool __thiscall
fineftp::UserDatabase::addUser
          (UserDatabase *this,string *username,string *password,string *param_3,
          Permission permissions)

{
  bool bVar1;
  ostream *poVar2;
  iterator iVar3;
  FtpUser *this_00;
  UserDatabase *this_01;
  __shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  FtpUser *local_38;
  
  this_01 = this;
  ::std::mutex::lock(&this->database_mutex_);
  bVar1 = isUsernameAnonymousUser(this_01,username);
  if (bVar1) {
    if ((this->anonymous_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      this_00 = (FtpUser *)operator_new(0x48);
      FtpUser::FtpUser(this_00,password,param_3,permissions);
      ::std::__shared_ptr<fineftp::FtpUser,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<fineftp::FtpUser,void>
                ((__shared_ptr<fineftp::FtpUser,(__gnu_cxx::_Lock_policy)2> *)&_Stack_48,this_00);
      ::std::__shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->anonymous_user_).
                  super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>,&_Stack_48);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
      poVar2 = ::std::operator<<((ostream *)&::std::cout,"Successfully added anonymous user.");
      bVar1 = true;
      ::std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_00111a32;
    }
    poVar2 = ::std::operator<<((ostream *)&::std::cerr,"Error adding user with username \"");
    poVar2 = ::std::operator<<(poVar2,(string *)username);
    poVar2 = ::std::operator<<(poVar2,
                               "\". The username denotes the anonymous user, which is already present."
                              );
    ::std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    iVar3 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>_>_>_>
            ::find(&(this->database_)._M_t,username);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->database_)._M_t._M_impl.super__Rb_tree_header) {
      local_38 = (FtpUser *)operator_new(0x48);
      FtpUser::FtpUser(local_38,password,param_3,permissions);
      ::std::__shared_ptr<fineftp::FtpUser,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<fineftp::FtpUser,void>
                ((__shared_ptr<fineftp::FtpUser,(__gnu_cxx::_Lock_policy)2> *)&_Stack_48,local_38);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<fineftp::FtpUser>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>>
                  *)&this->database_,username,(shared_ptr<fineftp::FtpUser> *)&_Stack_48);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
      poVar2 = ::std::operator<<((ostream *)&::std::cout,"Successfully added user \"");
      poVar2 = ::std::operator<<(poVar2,(string *)username);
      poVar2 = ::std::operator<<(poVar2,"\".");
      bVar1 = true;
      ::std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_00111a32;
    }
    poVar2 = ::std::operator<<((ostream *)&::std::cerr,"Error adding user with username \"");
    poVar2 = ::std::operator<<(poVar2,(string *)username);
    poVar2 = ::std::operator<<(poVar2,"\". The user already exists.");
    ::std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar1 = false;
LAB_00111a32:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar1;
}

Assistant:

bool UserDatabase::addUser(const std::string& username, const std::string& password, const std::string& local_root_path, Permission permissions)
  {
    std::lock_guard<decltype(database_mutex_)> database_lock(database_mutex_);

    if (isUsernameAnonymousUser(username))
    {
      if (anonymous_user_)
      {
        std::cerr << "Error adding user with username \"" << username << "\". The username denotes the anonymous user, which is already present." << std::endl;
        return false;
      }
      else
      {
        anonymous_user_ = std::shared_ptr<FtpUser>(new FtpUser(password, local_root_path, permissions));
#ifndef NDEBUG
        std::cout << "Successfully added anonymous user." << std::endl;
#endif // !NDEBUG
        return true;
      }
    }
    else
    {
      auto user_it = database_.find(username);
      if (user_it == database_.end())
      {
        database_.emplace(username, std::shared_ptr<FtpUser>(new FtpUser(password, local_root_path, permissions)));
#ifndef NDEBUG
        std::cout << "Successfully added user \"" << username << "\"." << std::endl;
#endif // !NDEBUG
        return true;
      }
      else
      {
        std::cerr << "Error adding user with username \"" << username << "\". The user already exists." << std::endl;
        return false;
      }
    }
  }